

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrss_test.cc
# Opt level: O3

void __thiscall HRSS_Poly3UnreducedInput_Test::TestBody(HRSS_Poly3UnreducedInput_Test *this)

{
  crypto_word_t *rhs;
  ulong uVar1;
  ulong uVar2;
  pointer *__ptr;
  char *pcVar3;
  long lVar4;
  AssertionResult gtest_ar;
  poly3 result;
  poly3 one;
  poly3 inverse;
  poly3 r;
  undefined1 local_3c8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3c0;
  Bytes local_3b8;
  AssertHelper local_3a8;
  undefined1 local_3a0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_398;
  crypto_word_t local_2f8;
  poly3 local_2f0;
  poly3 local_240;
  poly3 local_190;
  poly3 local_e0;
  
  poly3_rand(&local_e0);
  local_e0.s.v[10] = local_e0.s.v[10] & 0xfffffffffffffff;
  local_e0.a.v[10] = local_e0.a.v[10] & 0xfffffffffffffff;
  HRSS_poly3_invert(&local_190,&local_e0);
  HRSS_poly3_mul(&local_2f0,&local_190,&local_e0);
  memset(&local_240,0,0xb0);
  local_240.a.v[0] = 1;
  local_3c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xb0;
  local_3b8.span_.size_ = 0xb0;
  local_3c8 = (undefined1  [8])&local_240;
  local_3b8.span_.data_ = (uchar *)&local_2f0;
  testing::internal::CmpHelperEQ<Bytes,Bytes>
            ((internal *)local_3a0,"Bytes(reinterpret_cast<const uint8_t *>(&one), sizeof(one))",
             "Bytes(reinterpret_cast<const uint8_t *>(&result), sizeof(result))",(Bytes *)local_3c8,
             &local_3b8);
  if (local_3a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_3c8);
    if (local_398 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_398->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hrss/hrss_test.cc"
               ,0x6f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3b8,(Message *)local_3c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3b8);
    if (local_3c8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_3c8 + 8))();
    }
  }
  if (local_398 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_398,local_398);
  }
  uVar2 = local_e0.a.v[0] ^ 1;
  local_e0.a.v[0] = uVar2 | local_e0.s.v[0];
  uVar1 = local_e0.s.v[10] ^ 0x2000000000000000;
  local_e0.s.v[10] = local_e0.a.v[10] & uVar1;
  local_e0.a.v[10] = local_e0.a.v[10] ^ 0x2000000000000000 | uVar1;
  local_e0.s.v[0] = (local_e0.s.v[0] ^ 1) & uVar2;
  HRSS_poly3_mul(&local_2f0,&local_190,&local_e0);
  local_3c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_000000b0;
  local_3b8.span_.size_ = 0xb0;
  local_3c8 = (undefined1  [8])&local_240;
  local_3b8.span_.data_ = (uchar *)&local_2f0;
  testing::internal::CmpHelperEQ<Bytes,Bytes>
            ((internal *)local_3a0,"Bytes(reinterpret_cast<const uint8_t *>(&one), sizeof(one))",
             "Bytes(reinterpret_cast<const uint8_t *>(&result), sizeof(result))",(Bytes *)local_3c8,
             &local_3b8);
  if (local_3a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_3c8);
    if (local_398 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_398->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hrss/hrss_test.cc"
               ,0x79,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3b8,(Message *)local_3c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3b8);
    if (local_3c8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_3c8 + 8))();
    }
  }
  if (local_398 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_398,local_398);
  }
  lVar4 = 0;
  memset((poly3 *)local_3a0,0,0xa8);
  local_2f8 = 0x1000000000000000;
  HRSS_poly3_mul(&local_2f0,&local_240,(poly3 *)local_3a0);
  do {
    local_3b8.span_.data_ = (uchar *)0xffffffffffffffff;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)local_3c8,"~((crypto_word_t)0)","result.s.v[i]",
               (unsigned_long *)&local_3b8,(unsigned_long *)((long)local_2f0.s.v + lVar4));
    if (local_3c8[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_3b8);
      pcVar3 = "";
      if (local_3c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = (local_3c0->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_3a8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hrss/hrss_test.cc"
                 ,0x82,pcVar3);
      testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b8);
      testing::internal::AssertHelper::~AssertHelper(&local_3a8);
      if ((long *)local_3b8.span_.data_ != (long *)0x0) {
        (**(code **)(*(long *)local_3b8.span_.data_ + 8))();
      }
    }
    if (local_3c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_3c0,local_3c0);
    }
    local_3b8.span_.data_ = (uchar *)0xffffffffffffffff;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)local_3c8,"~((crypto_word_t)0)","result.a.v[i]",
               (unsigned_long *)&local_3b8,(unsigned_long *)((long)local_2f0.a.v + lVar4));
    if (local_3c8[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_3b8);
      pcVar3 = "";
      if (local_3c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = (local_3c0->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_3a8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hrss/hrss_test.cc"
                 ,0x83,pcVar3);
      testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b8);
      testing::internal::AssertHelper::~AssertHelper(&local_3a8);
      if ((long *)local_3b8.span_.data_ != (long *)0x0) {
        (**(code **)(*(long *)local_3b8.span_.data_ + 8))();
      }
    }
    if (local_3c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_3c0,local_3c0);
    }
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x50);
  local_3b8.span_.data_ = &DAT_fffffffffffffff;
  rhs = local_2f0.s.v + 10;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_3c8,"(1UL << ((701 % (sizeof(crypto_word_t) * 8)) - 1)) - 1",
             "result.s.v[((701 + (sizeof(crypto_word_t) * 8) - 1) / (sizeof(crypto_word_t) * 8)) - 1]"
             ,(unsigned_long *)&local_3b8,rhs);
  if (local_3c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_3b8);
    if (local_3c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_3c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hrss/hrss_test.cc"
               ,0x86,pcVar3);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b8);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((long *)local_3b8.span_.data_ != (long *)0x0) {
      (**(code **)(*(long *)local_3b8.span_.data_ + 8))();
    }
  }
  if (local_3c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_3c0,local_3c0);
  }
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_3c8,
             "result.s.v[((701 + (sizeof(crypto_word_t) * 8) - 1) / (sizeof(crypto_word_t) * 8)) - 1]"
             ,
             "result.a.v[((701 + (sizeof(crypto_word_t) * 8) - 1) / (sizeof(crypto_word_t) * 8)) - 1]"
             ,rhs,local_2f0.a.v + 10);
  if (local_3c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_3b8);
    if (local_3c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_3c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hrss/hrss_test.cc"
               ,0x87,pcVar3);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b8);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((long *)local_3b8.span_.data_ != (long *)0x0) {
      (**(code **)(*(long *)local_3b8.span_.data_ + 8))();
    }
  }
  if (local_3c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_3c0,local_3c0);
  }
  return;
}

Assistant:

TEST(HRSS, Poly3UnreducedInput) {
  // Check that |poly3_mul| works correctly with inputs that aren't reduced mod
  // Φ(N).
  poly3 r, inverse, result, one;
  poly3_rand(&r);
  // Drop the term at x^700 because |HRSS_poly3_invert| only handles reduced
  // inputs.
  r.s.v[WORDS_PER_POLY - 1] &= (UINT64_C(1) << (BITS_IN_LAST_WORD - 1)) - 1;
  r.a.v[WORDS_PER_POLY - 1] &= (UINT64_C(1) << (BITS_IN_LAST_WORD - 1)) - 1;
  HRSS_poly3_invert(&inverse, &r);
  HRSS_poly3_mul(&result, &inverse, &r);

  memset(&one, 0, sizeof(one));
  one.a.v[0] = 1;
  EXPECT_EQ(Bytes(reinterpret_cast<const uint8_t *>(&one), sizeof(one)),
            Bytes(reinterpret_cast<const uint8_t *>(&result), sizeof(result)));

  // |r| is reduced mod Φ(N), so add x^701 - 1 and recompute to ensure that we
  // get the same answer. (Since (x^701 - 1) ≡ 0 mod Φ(N).)
  poly3_word_add(&r.s.v[0], &r.a.v[0], 1, 1);
  poly3_word_add(&r.s.v[WORDS_PER_POLY - 1], &r.a.v[WORDS_PER_POLY - 1], 0,
                 UINT64_C(1) << BITS_IN_LAST_WORD);

  HRSS_poly3_mul(&result, &inverse, &r);
  EXPECT_EQ(Bytes(reinterpret_cast<const uint8_t *>(&one), sizeof(one)),
            Bytes(reinterpret_cast<const uint8_t *>(&result), sizeof(result)));

  // Check that x^700 × 1 gives -x^699 - x^698 … -1.
  poly3 x700;
  memset(&x700, 0, sizeof(x700));
  x700.a.v[WORDS_PER_POLY-1] = UINT64_C(1) << (BITS_IN_LAST_WORD - 1);
  HRSS_poly3_mul(&result, &one, &x700);

  for (size_t i = 0; i < WORDS_PER_POLY-1; i++) {
    EXPECT_EQ(CONSTTIME_TRUE_W, result.s.v[i]);
    EXPECT_EQ(CONSTTIME_TRUE_W, result.a.v[i]);
  }
  EXPECT_EQ((UINT64_C(1) << (BITS_IN_LAST_WORD - 1)) - 1,
            result.s.v[WORDS_PER_POLY - 1]);
  EXPECT_EQ(result.s.v[WORDS_PER_POLY - 1], result.a.v[WORDS_PER_POLY - 1]);
}